

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_fft.cpp
# Opt level: O2

void addTests_FFT(UnitTestFramework *framework)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,"fft:: random image direct and inverse FFT",&local_31);
  UnitTestFramework::add(framework,fft::RandomImageFFT,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void addTests_FFT( UnitTestFramework & framework )
{
    framework.add( fft::RandomImageFFT, "fft:: random image direct and inverse FFT" );
}